

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcu_list.hpp
# Opt level: O0

void __thiscall
gmlc::libguarded::
rcu_list<std::aligned_storage<256UL,_16UL>::type,_std::mutex,_MockAllocator<std::aligned_storage<256UL,_16UL>::type>_>
::~rcu_list(rcu_list<std::aligned_storage<256UL,_16UL>::type,_std::mutex,_MockAllocator<std::aligned_storage<256UL,_16UL>::type>_>
            *this)

{
  __pointer_type pnVar1;
  __pointer_type prVar2;
  __pointer_type pzVar3;
  bool bVar4;
  zombie_list_node *current_1;
  zombie_list_node *zn;
  node *current;
  node *n;
  rcu_list<std::aligned_storage<256UL,_16UL>::type,_std::mutex,_MockAllocator<std::aligned_storage<256UL,_16UL>::type>_>
  *this_local;
  
  current = std::
            atomic<gmlc::libguarded::rcu_list<std::aligned_storage<256UL,_16UL>::type,_std::mutex,_MockAllocator<std::aligned_storage<256UL,_16UL>::type>_>::node_*>
            ::load(&this->m_head,memory_order_seq_cst);
  while (current != (node *)0x0) {
    pnVar1 = std::
             atomic<gmlc::libguarded::rcu_list<std::aligned_storage<256UL,_16UL>::type,_std::mutex,_MockAllocator<std::aligned_storage<256UL,_16UL>::type>_>::node_*>
             ::load(&current->next,memory_order_seq_cst);
    std::
    allocator_traits<MockAllocator<gmlc::libguarded::rcu_list<std::aligned_storage<256ul,16ul>::type,std::mutex,MockAllocator<std::aligned_storage<256ul,16ul>::type>>::node>>
    ::
    destroy<gmlc::libguarded::rcu_list<std::aligned_storage<256ul,16ul>::type,std::mutex,MockAllocator<std::aligned_storage<256ul,16ul>::type>>::node>
              (&this->m_node_alloc,current);
    std::
    allocator_traits<MockAllocator<gmlc::libguarded::rcu_list<std::aligned_storage<256UL,_16UL>::type,_std::mutex,_MockAllocator<std::aligned_storage<256UL,_16UL>::type>_>::node>_>
    ::deallocate(&this->m_node_alloc,current,1);
    current = pnVar1;
  }
  current_1 = std::
              atomic<gmlc::libguarded::rcu_list<std::aligned_storage<256UL,_16UL>::type,_std::mutex,_MockAllocator<std::aligned_storage<256UL,_16UL>::type>_>::zombie_list_node_*>
              ::load(&this->m_zombie_head,memory_order_seq_cst);
  while( true ) {
    bVar4 = false;
    if (current_1 != (zombie_list_node *)0x0) {
      prVar2 = std::
               atomic<gmlc::libguarded::rcu_list<std::aligned_storage<256UL,_16UL>::type,_std::mutex,_MockAllocator<std::aligned_storage<256UL,_16UL>::type>_>::rcu_guard_*>
               ::load(&current_1->owner,memory_order_seq_cst);
      bVar4 = prVar2 == (__pointer_type)0x0;
    }
    if (!bVar4) break;
    pzVar3 = std::
             atomic<gmlc::libguarded::rcu_list<std::aligned_storage<256UL,_16UL>::type,_std::mutex,_MockAllocator<std::aligned_storage<256UL,_16UL>::type>_>::zombie_list_node_*>
             ::load(&current_1->next,memory_order_seq_cst);
    std::
    allocator_traits<MockAllocator<gmlc::libguarded::rcu_list<std::aligned_storage<256ul,16ul>::type,std::mutex,MockAllocator<std::aligned_storage<256ul,16ul>::type>>::node>>
    ::
    destroy<gmlc::libguarded::rcu_list<std::aligned_storage<256ul,16ul>::type,std::mutex,MockAllocator<std::aligned_storage<256ul,16ul>::type>>::node>
              (&this->m_node_alloc,current_1->zombie_node);
    std::
    allocator_traits<MockAllocator<gmlc::libguarded::rcu_list<std::aligned_storage<256UL,_16UL>::type,_std::mutex,_MockAllocator<std::aligned_storage<256UL,_16UL>::type>_>::node>_>
    ::deallocate(&this->m_node_alloc,current_1->zombie_node,1);
    std::
    allocator_traits<MockAllocator<gmlc::libguarded::rcu_list<std::aligned_storage<256ul,16ul>::type,std::mutex,MockAllocator<std::aligned_storage<256ul,16ul>::type>>::zombie_list_node>>
    ::
    destroy<gmlc::libguarded::rcu_list<std::aligned_storage<256ul,16ul>::type,std::mutex,MockAllocator<std::aligned_storage<256ul,16ul>::type>>::zombie_list_node>
              (&this->m_zombie_alloc,current_1);
    std::
    allocator_traits<MockAllocator<gmlc::libguarded::rcu_list<std::aligned_storage<256UL,_16UL>::type,_std::mutex,_MockAllocator<std::aligned_storage<256UL,_16UL>::type>_>::zombie_list_node>_>
    ::deallocate(&this->m_zombie_alloc,current_1,1);
    current_1 = pzVar3;
  }
  return;
}

Assistant:

rcu_list<T, M, Alloc>::~rcu_list()
{
    node* n = m_head.load();

    while (n != nullptr) {
        node* current = n;
        n = n->next.load();

        node_alloc_trait::destroy(m_node_alloc, current);
        node_alloc_trait::deallocate(m_node_alloc, current, 1);
    }

    zombie_list_node* zn = m_zombie_head.load();

    while (zn != nullptr && zn->owner.load() == nullptr) {
        zombie_list_node* current = zn;
        zn = zn->next.load();

        node_alloc_trait::destroy(m_node_alloc, current->zombie_node);
        node_alloc_trait::deallocate(m_node_alloc, current->zombie_node, 1);

        zombie_alloc_trait::destroy(m_zombie_alloc, current);
        zombie_alloc_trait::deallocate(m_zombie_alloc, current, 1);
    }
}